

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O1

void __thiscall
transwarp::detail::task_impl_base<$1a67ba37$>::schedule_impl
          (task_impl_base<_1a67ba37_> *this,bool reset,executor *executor)

{
  shared_ptr<transwarp::node> *psVar1;
  _Atomic_word *p_Var2;
  pointer psVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar5;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Head_base<0UL,_std::__future_base::_Result_base_*,_false> _Var8;
  int iVar9;
  runner<_9c922731_> *prVar10;
  shared_ptr<transwarp::listener> *listener;
  pointer psVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<_5bfabb08_> runner;
  weak_ptr<_4fdb7c5e_> self;
  __basic_future<void> local_68;
  code *local_58;
  code *pcStack_50;
  runner<_9c922731_> *local_48;
  _Head_base<0UL,_std::__future_base::_Result_base_*,_false> local_40;
  weak_ptr<_4fdb7c5e_> local_38;
  
  if (this->schedule_mode_ != true) {
    return;
  }
  if (!reset) {
    if ((this->future_).super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      return;
    }
    if (!reset) goto LAB_00197e27;
  }
  LOCK();
  (((this->node_).super___shared_ptr<transwarp::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->canceled_
  )._M_base._M_i = false;
  UNLOCK();
LAB_00197e27:
  std::
  __shared_ptr<transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>,void>
            ((__shared_ptr<transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)&local_68,(__weak_ptr<_b961c150_> *)&this->super_enable_shared_from_this<_4fdb7c5e_>
            );
  local_38.super___weak_ptr<_b961c150_>._M_ptr =
       (element_type *)
       local_68._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___weak_ptr<_b961c150_>._M_refcount._M_pi =
       local_68._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi;
  if (local_68._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_weak_count =
           (local_68._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_68._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_weak_count =
           (local_68._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  if (local_68._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  prVar10 = (runner<_9c922731_> *)operator_new(0xb0);
  runner<$9c922731$>::runner
            (prVar10,((this->node_).super___shared_ptr<transwarp::node,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->id_,&local_38,&this->parents_);
  local_48 = prVar10;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<transwarp::detail::runner<void,transwarp::consume_type,transwarp::detail::task_impl_base<void,transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vect___tr<transwarp::task<std::__cxx11::string>>,std::shared_ptr<transwarp::task<std::__cxx11::string>>>>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40,prVar10);
  psVar1 = &this->node_;
  psVar3 = this->listeners_[0].
           super__Vector_base<std::shared_ptr<transwarp::listener>,_std::allocator<std::shared_ptr<transwarp::listener>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar11 = this->listeners_[0].
                 super__Vector_base<std::shared_ptr<transwarp::listener>,_std::allocator<std::shared_ptr<transwarp::listener>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar3; psVar11 = psVar11 + 1
      ) {
    peVar4 = (psVar11->super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (**(code **)(*(long *)peVar4 + 0x10))(peVar4,0,psVar1);
  }
  std::__basic_future<void>::__basic_future(&local_68,(__state_type *)local_48);
  _Var7._M_pi = local_68._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar6 = local_68._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->future_).super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->future_).super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  (this->future_).super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var7._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_68._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  _Var8._M_head_impl = local_40._M_head_impl;
  prVar10 = local_48;
  peVar5 = (this->executor_).super___shared_ptr<transwarp::executor,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar5 == (element_type *)0x0) {
    if (executor == (executor *)0x0) {
      runner<$9c922731$>::operator()(local_48);
    }
    else {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_head_impl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_40._M_head_impl + 8) = *(int *)(local_40._M_head_impl + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_40._M_head_impl + 8) = *(int *)(local_40._M_head_impl + 8) + 1;
        }
      }
      local_58 = (code *)0x0;
      pcStack_50 = (code *)0x0;
      local_68._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_68._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_68._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)operator_new(0x10);
      (local_68._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr__State_baseV2 = (_func_int **)prVar10;
      ((local_68._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _M_result)._M_t.
      super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
      .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
           _Var8._M_head_impl;
      pcStack_50 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alok123t[P]HyINDEL/external/transwarp.h:2120:35)>
                   ::_M_invoke;
      local_58 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alok123t[P]HyINDEL/external/transwarp.h:2120:35)>
                 ::_M_manager;
      (*executor->_vptr_executor[3])(executor,&local_68,psVar1);
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
    }
  }
  else {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_head_impl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_40._M_head_impl + 8) = *(int *)(local_40._M_head_impl + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_40._M_head_impl + 8) = *(int *)(local_40._M_head_impl + 8) + 1;
      }
    }
    local_58 = (code *)0x0;
    pcStack_50 = (code *)0x0;
    local_68._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_68._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0x10);
    (local_68._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr__State_baseV2 = (_func_int **)prVar10;
    ((local_68._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_result)._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
         _Var8._M_head_impl;
    pcStack_50 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alok123t[P]HyINDEL/external/transwarp.h:2118:36)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alok123t[P]HyINDEL/external/transwarp.h:2118:36)>
               ::_M_manager;
    (*peVar5->_vptr_executor[3])(peVar5,&local_68,psVar1);
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,3);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_head_impl !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_head_impl);
  }
  if (local_38.super___weak_ptr<_b961c150_>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &(local_38.super___weak_ptr<_b961c150_>._M_refcount._M_pi)->_M_weak_count;
      iVar9 = *p_Var2;
      *p_Var2 = *p_Var2 + -1;
      UNLOCK();
    }
    else {
      iVar9 = (local_38.super___weak_ptr<_b961c150_>._M_refcount._M_pi)->_M_weak_count;
      (local_38.super___weak_ptr<_b961c150_>._M_refcount._M_pi)->_M_weak_count = iVar9 + -1;
    }
    if (iVar9 == 1) {
      (*(local_38.super___weak_ptr<_b961c150_>._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

void schedule_impl(bool reset, transwarp::executor* executor=nullptr) override {
        if (schedule_mode_ && (reset || !future_.valid())) {
            if (reset) {
                transwarp::detail::node_manip::set_canceled(*node_, false);
            }
            std::weak_ptr<task_impl_base> self = this->shared_from_this();
            using runner_t = transwarp::detail::runner<result_type, task_type, task_impl_base, decltype(parents_)>;
            std::shared_ptr<runner_t> runner = std::shared_ptr<runner_t>(new runner_t(node_->get_id(), self, parents_));
            raise_event(transwarp::event_type::before_scheduled);
            future_ = runner->get_future();
            if (executor_) {
                executor_->execute([runner]{ (*runner)(); }, node_);
            } else if (executor) {
                executor->execute([runner]{ (*runner)(); }, node_);
            } else {
                (*runner)();
            }
        }
    }